

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

RatioTestResult * __thiscall
fizplex::Simplex::run_ratio_test(Simplex *this,Candidate candidate,Base *base)

{
  RatioTestResult *in_RDI;
  byte in_stack_00000008;
  double in_stack_00000038;
  SVector alpha;
  SVector *in_stack_ffffffffffffff98;
  ColMatrix *in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffd8;
  Base *in_stack_ffffffffffffffe0;
  
  if ((in_stack_00000008 & 1) == 0) {
    ColMatrix::column(in_stack_ffffffffffffffa0,(size_t)in_stack_ffffffffffffff98);
    SVector::SVector((SVector *)&stack0xffffffffffffffd8,in_stack_ffffffffffffff98);
    Base::ftran(in_stack_ffffffffffffffe0,(SVector *)in_stack_ffffffffffffffd8);
    RatioTester::ratio_test
              ((RatioTester *)this,(LP *)base,
               (SVector *)
               alpha.values.
               super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (DVector *)
               alpha.values.
               super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (size_t)alpha.values.
                       super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                       ._M_impl.super__Vector_impl_data._M_start,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)candidate._0_8_,
               in_stack_00000038);
    SVector::~SVector((SVector *)0x130827);
  }
  else {
    memset(in_RDI,0,0x20);
  }
  return in_RDI;
}

Assistant:

Simplex::RatioTestResult Simplex::run_ratio_test(Simplex::Candidate candidate,
                                                 Base &base) const {
  // Can skip expensive calculation as it won't be used when optimal
  if (candidate.is_optimal)
    return Simplex::RatioTestResult();

  SVector alpha = lp.A.column(candidate.index);
  base.ftran(alpha);
  return RatioTester().ratio_test(lp, alpha, x, candidate.index, basic_indices,
                                  candidate.cost);
}